

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddNgon(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,
                   float thickness)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RDI;
  float thickness_00;
  float col_00;
  undefined4 in_XMM1_Da;
  float a_max;
  int in_stack_00000048;
  float in_stack_0000004c;
  float in_stack_00000050;
  float in_stack_00000054;
  ImVec2 *in_stack_00000058;
  ImDrawList *in_stack_00000060;
  ImDrawFlags in_stack_ffffffffffffffd8;
  
  thickness_00 = (float)((ulong)in_RDI >> 0x20);
  if (((in_EDX & 0xff000000) != 0) && (2 < in_ECX)) {
    col_00 = (((float)in_ECX - 1.0) * 6.2831855) / (float)in_ECX;
    PathArcTo(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
              in_stack_0000004c,in_stack_00000048);
    PathStroke((ImDrawList *)CONCAT44(in_ECX,in_XMM1_Da),(ImU32)col_00,in_stack_ffffffffffffffd8,
               thickness_00);
  }
  return;
}

Assistant:

void ImDrawList::AddNgon(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, ImDrawFlags_Closed, thickness);
}